

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O0

void __thiscall
Refal2::CQualifier::printLabels(CQualifier *this,ostream *outputStream,CPrintHelper *printHelper)

{
  size_t sVar1;
  bool bVar2;
  reference piVar3;
  _Self local_70;
  _Self local_68;
  const_iterator i;
  undefined1 local_50 [8];
  set<int,_std::less<int>,_std::allocator<int>_> a;
  CPrintHelper *printHelper_local;
  ostream *outputStream_local;
  CQualifier *this_local;
  
  a._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printHelper;
  bVar2 = IsIncludeAllLabels(this);
  if ((bVar2) && (bVar2 = CFastSet<int>::IsEmpty(&this->labels), !bVar2)) {
    std::operator<<(outputStream,"(");
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  CFastSet<int>::GetSet(&this->labels,(set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  local_68._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
    bVar2 = std::operator!=(&local_68,&local_70);
    if (!bVar2) break;
    std::operator<<(outputStream,"/");
    sVar1 = a._M_t._M_impl.super__Rb_tree_header._M_node_count;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_68);
    (**(code **)(*(long *)sVar1 + 8))(sVar1,outputStream,*piVar3);
    std::operator<<(outputStream,"/");
    std::_Rb_tree_const_iterator<int>::operator++(&local_68);
  }
  bVar2 = IsIncludeAllLabels(this);
  if ((bVar2) && (bVar2 = CFastSet<int>::IsEmpty(&this->labels), !bVar2)) {
    std::operator<<(outputStream,")");
  }
  bVar2 = IsIncludeAllLabels(this);
  if (bVar2) {
    std::operator<<(outputStream,"F ");
  }
  else {
    std::operator<<(outputStream,"(F) ");
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void CQualifier::printLabels( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	if( IsIncludeAllLabels() && !labels.IsEmpty() ) {
		outputStream << "(";
	}

	std::set<TLabel> a;
	labels.GetSet( &a );
	for( std::set<TLabel>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << "/";
		printHelper.Label( outputStream, *i );
		outputStream << "/";
	}

	if( IsIncludeAllLabels() && !labels.IsEmpty() ) {
		outputStream << ")";
	}

	if( IsIncludeAllLabels() ) {
		outputStream << "F ";
	} else {
		outputStream << "(F) ";
	}
}